

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playableWorld.cpp
# Opt level: O2

string * __thiscall
playableWorld::turn_left_abi_cxx11_(string *__return_storage_ptr__,playableWorld *this)

{
  allocator local_39;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,"left",&local_39);
  std::__cxx11::string::_M_assign((string *)&this->agent_direction);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->agent_direction);
  return __return_storage_ptr__;
}

Assistant:

string playableWorld::turn_left()
{
  
    set_agent_direction("left");
  
  return get_agent_direction();
}